

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPundef(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  MacroSymbol *pMVar2;
  char *pcVar3;
  TParseContextBase *pTVar4;
  _func_int **pp_Var5;
  
  iVar1 = scanToken(this,ppToken);
  pTVar4 = this->parseContext;
  if (iVar1 == 0xa2) {
    (*(pTVar4->super_TParseVersions)._vptr_TParseVersions[0x37])
              (pTVar4,ppToken,ppToken->name,"#undef");
    iVar1 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    pMVar2 = lookupMacroDef(this,iVar1);
    if (pMVar2 != (MacroSymbol *)0x0) {
      pMVar2->field_0x48 = pMVar2->field_0x48 | 4;
    }
    iVar1 = scanToken(this,ppToken);
    if (iVar1 == 10) {
      return 10;
    }
    pTVar4 = this->parseContext;
    pp_Var5 = (pTVar4->super_TParseVersions)._vptr_TParseVersions;
    pcVar3 = "can only be followed by a single macro name";
  }
  else {
    pp_Var5 = (pTVar4->super_TParseVersions)._vptr_TParseVersions;
    pcVar3 = "must be followed by macro name";
  }
  (*pp_Var5[0x2f])(pTVar4,ppToken,pcVar3,"#undef","");
  return iVar1;
}

Assistant:

int TPpContext::CPPundef(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "must be followed by macro name", "#undef", "");

        return token;
    }

    parseContext.reservedPpErrorCheck(ppToken->loc, ppToken->name, "#undef");

    MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
    if (macro != nullptr)
        macro->undef = 1;
    token = scanToken(ppToken);
    if (token != '\n')
        parseContext.ppError(ppToken->loc, "can only be followed by a single macro name", "#undef", "");

    return token;
}